

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O3

QString * __thiscall QWidget::styleSheet(QString *__return_storage_ptr__,QWidget *this)

{
  long lVar1;
  Data *pDVar2;
  
  lVar1 = *(long *)(*(long *)&this->field_0x8 + 0x78);
  if (lVar1 != 0) {
    pDVar2 = *(Data **)(lVar1 + 0x48);
    (__return_storage_ptr__->d).d = pDVar2;
    (__return_storage_ptr__->d).ptr = *(char16_t **)(lVar1 + 0x50);
    (__return_storage_ptr__->d).size = *(qsizetype *)(lVar1 + 0x58);
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    return __return_storage_ptr__;
  }
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  return __return_storage_ptr__;
}

Assistant:

QString QWidget::styleSheet() const
{
    Q_D(const QWidget);
    if (!d->extra)
        return QString();
    return d->extra->styleSheet;
}